

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_lambdaref_expression.cpp
# Opt level: O2

void __thiscall
duckdb::BoundLambdaRefExpression::BoundLambdaRefExpression
          (BoundLambdaRefExpression *this,LogicalType *type,ColumnBinding binding,idx_t lambda_idx,
          idx_t depth)

{
  LogicalType local_68;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  LogicalType::LogicalType(&local_68,type);
  BoundLambdaRefExpression(this,&local_50,&local_68,binding,lambda_idx,depth);
  LogicalType::~LogicalType(&local_68);
  ::std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

BoundLambdaRefExpression::BoundLambdaRefExpression(LogicalType type, ColumnBinding binding, idx_t lambda_idx,
                                                   idx_t depth)
    : BoundLambdaRefExpression(string(), std::move(type), binding, lambda_idx, depth) {
}